

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O2

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstruct<float>_>::TPZDohrPrecond
          (TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *this,
          TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *cp)

{
  atomic_int *paVar1;
  TPZReference *pTVar2;
  int64_t iVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZBaseMatrix_01818e68;
  iVar3 = (cp->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow =
       (cp->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol = iVar3;
  cVar4 = (cp->super_TPZMatrix<float>).super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed =
       (cp->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDefPositive = cVar4;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZDohrPrecond_01817458;
  std::__cxx11::
  list<TPZAutoPointer<TPZDohrSubstruct<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<float>_>_>_>
  ::list(&this->fGlobal,&cp->fGlobal);
  this->fCoarse = (TPZStepSolver<float> *)0x0;
  this->fNumCoarse = cp->fNumCoarse;
  this->fNumThreads = cp->fNumThreads;
  pTVar2 = (cp->fAssemble).fRef;
  (this->fAssemble).fRef = pTVar2;
  LOCK();
  paVar1 = &pTVar2->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  if (cp->fCoarse != (TPZStepSolver<float> *)0x0) {
    iVar5 = (*(cp->fCoarse->super_TPZMatrixSolver<float>).super_TPZSolver.super_TPZSavable.
              _vptr_TPZSavable[9])();
    this->fCoarse = (TPZStepSolver<float> *)CONCAT44(extraout_var,iVar5);
  }
  return;
}

Assistant:

TPZDohrPrecond<TVar, TSubStruct>::TPZDohrPrecond(const TPZDohrPrecond<TVar, TSubStruct> &cp) : TPZMatrix<TVar>(cp), fGlobal(cp.fGlobal), fCoarse(0),
fNumCoarse(cp.fNumCoarse), fNumThreads(cp.fNumThreads), fAssemble(cp.fAssemble)
{
	if (cp.fCoarse) {
		fCoarse = (TPZStepSolver<TVar> *) cp.fCoarse->Clone();
	}
}